

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_subgraph.cpp
# Opt level: O3

void __thiscall
Adjacency_Subgraph_local_global_Test::TestBody(Adjacency_Subgraph_local_global_Test *this)

{
  AssertHelper AVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  StringLike<const_char_*> *regex;
  AssertHelper AVar7;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  DeathTest *gtest_dt;
  Adjacency_Subgraph subgraph;
  Adjacency_Graph<false> graph;
  AssertHelper local_170;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  int local_14c;
  undefined1 local_148 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> vStack_140;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_128;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_110;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  Adjacency_Subgraph local_d8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_70;
  Adjacency_Graph<false> local_58;
  
  Disa::create_graph_structured<false>(&local_58,3);
  vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&DAT_00000004;
  vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000005;
  local_148 = (undefined1  [8])0x1;
  vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_00000007;
  __l._M_len = 5;
  __l._M_array = (iterator)local_148;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_168,__l,(allocator_type *)&local_170);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph(&local_d8,&local_58,&local_168,0);
  if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_170.data_ = (AssertHelperData *)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::local_global(&local_d8,(size_t *)&local_170);
  local_14c = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_148,"subgraph.local_global(0)","1",(unsigned_long *)&local_168,
             &local_14c);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x15d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_170.data_ = (AssertHelperData *)0x1;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::local_global(&local_d8,(size_t *)&local_170);
  local_14c = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_148,"subgraph.local_global(1)","3",(unsigned_long *)&local_168,
             &local_14c);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x15e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_170.data_ = (AssertHelperData *)0x2;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::local_global(&local_d8,(size_t *)&local_170);
  local_14c = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_148,"subgraph.local_global(2)","4",(unsigned_long *)&local_168,
             &local_14c);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x15f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_170.data_ = (AssertHelperData *)0x3;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::local_global(&local_d8,(size_t *)&local_170);
  local_14c = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_148,"subgraph.local_global(3)","5",(unsigned_long *)&local_168,
             &local_14c);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x160,pcVar5);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_170.data_ = (AssertHelperData *)&DAT_00000004;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::local_global(&local_d8,(size_t *)&local_170);
  local_14c = 7;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_148,"subgraph.local_global(4)","7",(unsigned_long *)&local_168,
             &local_14c);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x161,pcVar5);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_170.data_ = (AssertHelperData *)&DAT_00000004;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_170;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_168,__l_00,(allocator_type *)&local_14c);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph
            ((Adjacency_Subgraph *)local_148,&local_58,&local_168,1);
  local_d8.hash_parent = (size_t)local_148;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&local_d8.graph.vertex_adjacent_list,&vStack_140);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&local_d8.graph.offset,&local_128);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&local_d8.i_local_global,&local_110);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&local_d8.level_set_value,&local_f8);
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph((Adjacency_Subgraph *)local_148);
  if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_170.data_ = (AssertHelperData *)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::local_global(&local_d8,(size_t *)&local_170);
  local_14c = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_148,"subgraph.local_global(0)","4",(unsigned_long *)&local_168,
             &local_14c);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x165,pcVar5);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_170.data_ = (AssertHelperData *)0x1;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::local_global(&local_d8,(size_t *)&local_170);
  local_14c = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_148,"subgraph.local_global(1)","1",(unsigned_long *)&local_168,
             &local_14c);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x166,pcVar5);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_170.data_ = (AssertHelperData *)0x2;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::local_global(&local_d8,(size_t *)&local_170);
  local_14c = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_148,"subgraph.local_global(2)","3",(unsigned_long *)&local_168,
             &local_14c);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x167,pcVar5);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_170.data_ = (AssertHelperData *)0x3;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::local_global(&local_d8,(size_t *)&local_170);
  local_14c = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_148,"subgraph.local_global(3)","5",(unsigned_long *)&local_168,
             &local_14c);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x168,pcVar5);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  local_170.data_ = (AssertHelperData *)&DAT_00000004;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)Disa::Adjacency_Subgraph::local_global(&local_d8,(size_t *)&local_170);
  local_14c = 7;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_148,"subgraph.local_global(4)","7",(unsigned_long *)&local_168,
             &local_14c);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_168);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)
               vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x169,pcVar5);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&vStack_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x1596ac;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_148,
               (testing *)&local_168,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_70,(PolymorphicMatcher *)local_148);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 vStack_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("subgraph.local_global(7) == 0",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_70,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
                       ,0x16b,(DeathTest **)&local_170);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_70);
    AVar7.data_ = local_170.data_;
    if (!bVar2) goto LAB_001184e0;
    if (local_170.data_ == (AssertHelperData *)0x0) goto LAB_00118536;
    iVar4 = (**(code **)(*(long *)local_170.data_ + 0x10))(local_170.data_);
    AVar1.data_ = local_170.data_;
    if (iVar4 == 0) {
      iVar4 = (**(code **)(*(long *)local_170.data_ + 0x18))(local_170.data_);
      bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
      cVar3 = (**(code **)(*(long *)AVar1.data_ + 0x20))(AVar1.data_,bVar2);
      if (cVar3 == '\0') {
        (**(code **)(*(long *)AVar7.data_ + 8))(AVar7.data_);
        goto LAB_001184e0;
      }
    }
    else if (iVar4 == 1) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        local_148 = (undefined1  [8])&DAT_00000007;
        Disa::Adjacency_Subgraph::local_global(&local_d8,(size_t *)local_148);
      }
      (**(code **)(*(long *)local_170.data_ + 0x28))(local_170.data_,2);
      (**(code **)(*(long *)AVar1.data_ + 0x28))(AVar1.data_,0);
    }
    lVar6 = *(long *)AVar7.data_;
  }
  else {
LAB_001184e0:
    testing::Message::Message((Message *)local_148);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x16b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if (local_148 == (undefined1  [8])0x0) goto LAB_00118536;
    lVar6 = *(long *)local_148;
    AVar7.data_ = (AssertHelperData *)local_148;
  }
  (**(code **)(lVar6 + 8))(AVar7.data_);
LAB_00118536:
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph(&local_d8);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(&local_58);
  return;
}

Assistant:

TEST(Adjacency_Subgraph, local_global) {
  Adjacency_Graph graph = create_graph_structured<false>(3);

  // Test local_global on primary subgraph.
  Adjacency_Subgraph subgraph(graph, {1, 3, 4, 5, 7});
  EXPECT_EQ(subgraph.local_global(0), 1);
  EXPECT_EQ(subgraph.local_global(1), 3);
  EXPECT_EQ(subgraph.local_global(2), 4);
  EXPECT_EQ(subgraph.local_global(3), 5);
  EXPECT_EQ(subgraph.local_global(4), 7);

  // Test local_global on both level and primary parts of the subgraph.
  subgraph = Adjacency_Subgraph(graph, {4}, 1);
  EXPECT_EQ(subgraph.local_global(0), 4);
  EXPECT_EQ(subgraph.local_global(1), 1);
  EXPECT_EQ(subgraph.local_global(2), 3);
  EXPECT_EQ(subgraph.local_global(3), 5);
  EXPECT_EQ(subgraph.local_global(4), 7);

  EXPECT_DEATH(subgraph.local_global(7) == 0, "./*");
}